

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

bool P_CheckForGLNodes(void)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)numsubsectors;
  if (numsubsectors < 1) {
    uVar3 = uVar4;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      uVar2 = CheckForMissingSegs();
      if (0 < (int)uVar2) {
        Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n",(ulong)uVar2);
      }
      return uVar2 == 0;
    }
    if ((subsectors[uVar4].firstline)->v1 !=
        subsectors[uVar4].firstline[(ulong)subsectors[uVar4].numlines - 1].v2) break;
    lVar5 = 0;
    while ((ulong)subsectors[uVar4].numlines * 0x30 + 0x30 != lVar5 + 0x30) {
      plVar1 = (long *)((long)&segs->linedef + lVar5);
      lVar5 = lVar5 + 0x30;
      if (*plVar1 == 0) {
        return true;
      }
    }
    uVar4 = uVar4 + 1;
  }
  return false;
}

Assistant:

bool P_CheckForGLNodes()
{
	int i;

	for(i=0;i<numsubsectors;i++)
	{
		subsector_t * sub = &subsectors[i];
		seg_t * firstseg = sub->firstline;
		seg_t * lastseg = sub->firstline + sub->numlines - 1;

		if (firstseg->v1 != lastseg->v2)
		{
			// This subsector is incomplete which means that these
			// are normal nodes
			return false;
		}
		else
		{
			for(DWORD j=0;j<sub->numlines;j++)
			{
				if (segs[j].linedef==NULL)	// miniseg
				{
					// We already have GL nodes. Great!
					return true;
				}
			}
		}
	}
	// all subsectors were closed but there are no minisegs
	// Although unlikely this can happen. Such nodes are not a problem.
	// all that is left is to check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted\nThe BSP needs to be rebuilt.\n", missing);
	}
	return missing == 0;
}